

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O2

DdNode * RAbuildSubset(DdManager *dd,DdNode *node,ApproxInfo *info)

{
  int *piVar1;
  DdHalfWord DVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  NodeData *infoN;
  
  pDVar11 = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (pDVar11->index == 0x7fffffff) {
    return node;
  }
  uVar7 = (ulong)((uint)node & 1);
  pDVar10 = (DdNode *)((ulong)(pDVar11->type).kids.T ^ uVar7);
  pDVar6 = (DdNode *)((ulong)(pDVar11->type).kids.E ^ uVar7);
  iVar3 = st__lookup(info->table,(char *)pDVar11,(char **)&infoN);
  if (iVar3 == 0) {
    fwrite("Something is wrong, ought to be in info table\n",0x2e,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INTERNAL_ERROR;
    return (DdNode *)0x0;
  }
  if (pDVar11 == node) {
    pDVar5 = infoN->resultP;
  }
  else {
    pDVar5 = infoN->resultN;
  }
  if (pDVar5 != (DdNode *)0x0) {
    return pDVar5;
  }
  switch(infoN->replace) {
  case '\x01':
    goto LAB_00646728;
  case '\x02':
    pDVar6 = pDVar10;
LAB_00646728:
    pDVar11 = RAbuildSubset(dd,pDVar6,info);
    return pDVar11;
  case '\x03':
    return info->zero;
  case '\x04':
    pDVar11 = (pDVar11->type).kids.T;
    DVar2 = pDVar11->index;
    pDVar6 = info->zero;
    pDVar10 = RAbuildSubset(dd,(DdNode *)(uVar7 ^ (ulong)(pDVar11->type).kids.T),info);
    if (pDVar10 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar11 = (DdNode *)((ulong)pDVar10 & 0xfffffffffffffffe);
    pDVar11->ref = pDVar11->ref + 1;
    if (((ulong)pDVar10 & 1) == 0) {
      pDVar5 = pDVar10;
      pDVar11 = pDVar6;
      if ((pDVar10 == pDVar6) ||
         (pDVar5 = cuddUniqueInter(dd,DVar2,pDVar10,pDVar6), pDVar11 = pDVar10,
         pDVar5 != (DdNode *)0x0)) {
LAB_0064683a:
        piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar5;
      }
    }
    else {
      pDVar5 = pDVar11;
      if ((pDVar11 == (DdNode *)((ulong)pDVar6 ^ 1)) ||
         (pDVar5 = cuddUniqueInter(dd,DVar2,pDVar11,(DdNode *)((ulong)pDVar6 ^ 1)),
         pDVar10 = pDVar11, pDVar5 != (DdNode *)0x0)) {
        pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
        goto LAB_0064683a;
      }
    }
    break;
  case '\x05':
    pDVar11 = (pDVar11->type).kids.T;
    DVar2 = pDVar11->index;
    pDVar6 = info->one;
    pDVar11 = RAbuildSubset(dd,(DdNode *)(uVar7 ^ (ulong)(pDVar11->type).kids.E),info);
    if (pDVar11 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar10 = (DdNode *)((ulong)pDVar11 ^ 1);
    if (pDVar6 != pDVar10) {
      pDVar6 = cuddUniqueInter(dd,DVar2,pDVar6,pDVar10);
    }
    if (pDVar6 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return (DdNode *)((ulong)pDVar6 ^ 1);
    }
    break;
  default:
    pDVar10 = RAbuildSubset(dd,pDVar10,info);
    if (pDVar10 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar5 = (DdNode *)((ulong)pDVar10 & 0xfffffffffffffffe);
    pDVar5->ref = pDVar5->ref + 1;
    pDVar6 = RAbuildSubset(dd,pDVar6,info);
    if (pDVar6 != (DdNode *)0x0) {
      pDVar8 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
      pDVar8->ref = pDVar8->ref + 1;
      if (((ulong)pDVar10 & 1) == 0) {
        pDVar4 = pDVar10;
        pDVar9 = pDVar5;
        if ((pDVar10 == pDVar6) ||
           (pDVar4 = cuddUniqueInter(dd,pDVar11->index,pDVar10,pDVar6), pDVar9 = pDVar8,
           pDVar4 != (DdNode *)0x0)) {
LAB_00646856:
          pDVar5->ref = pDVar5->ref - 1;
          pDVar9->ref = pDVar9->ref - 1;
          if (pDVar11 == node) {
            infoN->resultP = pDVar4;
            return pDVar4;
          }
          infoN->resultN = pDVar4;
          return pDVar4;
        }
        Cudd_RecursiveDeref(dd,pDVar6);
      }
      else {
        pDVar6 = (DdNode *)((ulong)pDVar6 ^ 1);
        pDVar10 = pDVar5;
        if ((pDVar5 == pDVar6) ||
           (pDVar10 = cuddUniqueInter(dd,pDVar11->index,pDVar5,pDVar6), pDVar10 != (DdNode *)0x0)) {
          pDVar4 = (DdNode *)((ulong)pDVar10 ^ 1);
          pDVar9 = pDVar8;
          goto LAB_00646856;
        }
        Cudd_RecursiveDeref(dd,pDVar6);
        pDVar10 = pDVar5;
      }
    }
  }
  Cudd_RecursiveDeref(dd,pDVar10);
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
RAbuildSubset(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  ApproxInfo * info /* node info */)
{
    DdNode *Nt, *Ne, *N, *t, *e, *r;
    NodeData *infoN;

    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);

    Nt = Cudd_NotCond(cuddT(N), Cudd_IsComplement(node));
    Ne = Cudd_NotCond(cuddE(N), Cudd_IsComplement(node));

    if ( st__lookup(info->table, (const char *)N, (char **)&infoN)) {
        if (N == node ) {
            if (infoN->resultP != NULL) {
                return(infoN->resultP);
            }
        } else {
            if (infoN->resultN != NULL) {
                return(infoN->resultN);
            }
        }
        if (infoN->replace == REPLACE_T) {
            r = RAbuildSubset(dd, Ne, info);
            return(r);
        } else if (infoN->replace == REPLACE_E) {
            r = RAbuildSubset(dd, Nt, info);
            return(r);
        } else if (infoN->replace == REPLACE_N) {
            return(info->zero);
        } else if (infoN->replace == REPLACE_TT) {
            DdNode *Ntt = Cudd_NotCond(cuddT(cuddT(N)),
                                       Cudd_IsComplement(node));
            int index = cuddT(N)->index;
            e = info->zero;
            t = RAbuildSubset(dd, Ntt, info);
            if (t == NULL) {
                return(NULL);
            }
            cuddRef(t);
            if (Cudd_IsComplement(t)) {
                t = Cudd_Not(t);
                e = Cudd_Not(e);
                r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
                if (r == NULL) {
                    Cudd_RecursiveDeref(dd, t);
                    return(NULL);
                }
                r = Cudd_Not(r);
            } else {
                r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
                if (r == NULL) {
                    Cudd_RecursiveDeref(dd, t);
                    return(NULL);
                }
            }
            cuddDeref(t);
            return(r);
        } else if (infoN->replace == REPLACE_TE) {
            DdNode *Nte = Cudd_NotCond(cuddE(cuddT(N)),
                                       Cudd_IsComplement(node));
            int index = cuddT(N)->index;
            t = info->one;
            e = RAbuildSubset(dd, Nte, info);
            if (e == NULL) {
                return(NULL);
            }
            cuddRef(e);
            e = Cudd_Not(e);
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_RecursiveDeref(dd, e);
                return(NULL);
            }
            r =Cudd_Not(r);
            cuddDeref(e);
            return(r);
        }
    } else {
        (void) fprintf(dd->err,
                       "Something is wrong, ought to be in info table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }

    t = RAbuildSubset(dd, Nt, info);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = RAbuildSubset(dd, Ne, info);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if (N == node) {
        infoN->resultP = r;
    } else {
        infoN->resultN = r;
    }

    return(r);

}